

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O0

void __thiscall PressDelayHandler::PressDelayHandler(PressDelayHandler *this,QObject *parent)

{
  QObject *in_RSI;
  QObject *in_RDI;
  
  QObject::QObject(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR_metaObject_00d36800;
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 0x10));
  QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_>::QScopedPointer
            ((QScopedPointer<QMouseEvent,_QScopedPointerDeleter<QMouseEvent>_> *)(in_RDI + 0x18),
             (QMouseEvent *)0x0);
  in_RDI[0x20] = (QObject)0x0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)in_RSI,in_RDI);
  *(undefined4 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

PressDelayHandler(QObject *parent = nullptr)
        : QObject(parent)
        , sendingEvent(false)
        , mouseButton(Qt::NoButton)
        , mouseTarget(nullptr)
        , mouseEventSource(Qt::MouseEventNotSynthesized)
    { }